

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

double nonius::detail::
       weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (int k,int q,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  int iVar1;
  difference_type dVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  reference pdVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RCX;
  int in_ESI;
  int in_EDI;
  double dVar4;
  double xj1;
  double xj;
  double g;
  int j;
  double idx;
  difference_type count;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_10;
  double local_8;
  
  dVar2 = __gnu_cxx::operator-(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  dVar4 = (double)((dVar2 + -1) * (long)in_EDI) / (double)in_ESI;
  iVar1 = (int)dVar4;
  dVar4 = dVar4 - (double)iVar1;
  __first = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (__first,in_RCX,in_stack_ffffffffffffffa0);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator[](&local_10,(long)iVar1);
  local_8 = *pdVar3;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              (in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    std::
    min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&stack0xffffffffffffff90);
    local_8 = local_8 + dVar4 * (*pdVar3 - local_8);
  }
  return local_8;
}

Assistant:

double weighted_average_quantile(int k, int q, Iterator first, Iterator last) {
            auto count = last - first;
            double idx = (count - 1) * k /static_cast<double>(q);
            int j = static_cast<int>(idx);
            double g = idx - j;
            std::nth_element(first, first+j, last);
            auto xj = first[j];
            if(g == 0) return xj;

            auto xj1 = *std::min_element(first+(j+1), last);
            return xj + g * (xj1 - xj);
        }